

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O0

void __thiscall OpenMD::InversePowerSeries::initialize(InversePowerSeries *this)

{
  value_type vVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  reference pvVar6;
  size_type sVar7;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  vector<double,_std::allocator<double>_> coefficients;
  vector<int,_std::allocator<int>_> powers;
  InversePowerSeriesInteractionType *ipsit;
  int atid2;
  int atid1;
  AtomType *at2;
  AtomType *at1;
  int ipstid2;
  int ipstid1;
  NonBondedInteractionType *nbt;
  KeyType keys;
  MapTypeIterator j;
  NonBondedInteractionTypeContainer *nbiTypes;
  AtomType *in_stack_fffffffffffffd68;
  AtomType *in_stack_fffffffffffffd70;
  AtomType *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  errorStruct *in_stack_fffffffffffffd88;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_fffffffffffffd90;
  size_type in_stack_fffffffffffffd98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  value_type in_stack_fffffffffffffdac;
  ForceField *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffdc0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdf0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdf8;
  AtomType *in_stack_fffffffffffffe00;
  AtomType *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  string local_f8 [32];
  string local_d8 [32];
  long local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  int local_9c;
  _Base_ptr local_98;
  undefined1 local_90;
  int local_84;
  AtomType *local_80;
  AtomType *local_78;
  value_type local_48;
  value_type local_44;
  AtomType *local_40;
  vector<double,_std::allocator<double>_> local_38;
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  local_20;
  NonBondedInteractionTypeContainer *local_18;
  undefined4 local_c;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2a2458);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x2a2471);
  std::
  vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
           *)0x2a2482);
  ForceField::getNAtomType((ForceField *)0x2a2493);
  local_c = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->index_)
  ;
  local_18 = ForceField::getNonBondedInteractionTypes(*(ForceField **)(in_RDI + 0x70));
  std::
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  ::_Rb_tree_iterator(&local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2a24f1);
  local_40 = (AtomType *)
             TypeContainer<OpenMD::NonBondedInteractionType,_2>::beginType
                       (in_stack_fffffffffffffd90,(MapTypeIterator *)in_stack_fffffffffffffd88);
  while (local_40 != (AtomType *)0x0) {
    bVar2 = NonBondedInteractionType::isInversePowerSeries((NonBondedInteractionType *)local_40);
    if (bVar2) {
      TypeContainer<OpenMD::NonBondedInteractionType,_2>::getKeys
                ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)in_stack_fffffffffffffd78,
                 (MapTypeIterator *)in_stack_fffffffffffffd70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd80,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_38,0);
      local_78 = ForceField::getAtomType
                           (in_stack_fffffffffffffdb0,
                            (string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))
      ;
      if (local_78 == (AtomType *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_38,0);
        uVar3 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_38,0);
        uVar4 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_38,1);
        uVar5 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "InversePowerSeries::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n"
                 ,uVar3,uVar4,uVar5);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_38,1);
      local_80 = ForceField::getAtomType
                           (in_stack_fffffffffffffdb0,
                            (string *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))
      ;
      if (local_80 == (AtomType *)0x0) {
        in_stack_fffffffffffffdf0 = &local_38;
        in_stack_fffffffffffffdf8 = (vector<int,_std::allocator<int>_> *)0x1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffdf0,1);
        in_stack_fffffffffffffe00 = (AtomType *)std::__cxx11::string::c_str();
        in_stack_fffffffffffffe14 = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffdf0,0);
        in_stack_fffffffffffffe08 = (AtomType *)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffdf8);
        uVar3 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "InversePowerSeries::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                 ,in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,uVar3);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      local_84 = AtomType::getIdent(local_78);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_84);
      if (*pvVar6 == -1) {
        sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2a2880);
        local_44 = (value_type)sVar7;
        pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffd90,
                           (value_type_conflict1 *)in_stack_fffffffffffffd88);
        vVar1 = local_44;
        local_98 = (_Base_ptr)pVar8.first._M_node;
        local_90 = pVar8.second;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_84);
        *pvVar6 = vVar1;
      }
      local_9c = AtomType::getIdent(local_80);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_9c);
      if (*pvVar6 == -1) {
        in_stack_fffffffffffffdb0 = (ForceField *)(in_RDI + 0x10);
        sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2a2938);
        local_48 = (value_type)sVar7;
        pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffd90,
                           (value_type_conflict1 *)in_stack_fffffffffffffd88);
        in_stack_fffffffffffffdc0 = pVar8.first._M_node;
        in_stack_fffffffffffffdbf = pVar8.second;
        in_stack_fffffffffffffdac = local_48;
        local_b0 = in_stack_fffffffffffffdc0._M_node;
        local_a8 = in_stack_fffffffffffffdbf;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_9c);
        *pvVar6 = in_stack_fffffffffffffdac;
      }
      if (local_40 == (AtomType *)0x0) {
        local_b8 = 0;
      }
      else {
        local_b8 = __dynamic_cast(local_40,&NonBondedInteractionType::typeinfo,
                                  &InversePowerSeriesInteractionType::typeinfo,0);
      }
      if (local_b8 == 0) {
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffd68);
        in_stack_fffffffffffffd90 =
             (TypeContainer<OpenMD::NonBondedInteractionType,_2> *)std::__cxx11::string::c_str();
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffd68);
        in_stack_fffffffffffffd80 = local_f8;
        uVar3 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffd88 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "InversePowerSeries::initialize could not convert NonBondedInteractionType\n\tto InversePowerSeriesInteractionType for %s - %s interaction.\n"
                 ,in_stack_fffffffffffffd90,uVar3);
        std::__cxx11::string::~string(in_stack_fffffffffffffd80);
        std::__cxx11::string::~string(local_d8);
        in_stack_fffffffffffffd88->severity = 1;
        in_stack_fffffffffffffd88->isFatal = 1;
        simError();
      }
      InversePowerSeriesInteractionType::getPowers
                ((InversePowerSeriesInteractionType *)in_stack_fffffffffffffd68);
      InversePowerSeriesInteractionType::getCoefficients
                ((InversePowerSeriesInteractionType *)in_stack_fffffffffffffd68);
      in_stack_fffffffffffffd70 = local_78;
      in_stack_fffffffffffffd78 = local_80;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0._M_node,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0._M_node,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      addExplicitInteraction
                ((InversePowerSeries *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                 ,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffdf0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
    }
    in_stack_fffffffffffffd68 =
         (AtomType *)
         TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType
                   (in_stack_fffffffffffffd90,(MapTypeIterator *)in_stack_fffffffffffffd88);
    local_40 = in_stack_fffffffffffffd68;
  }
  *(undefined1 *)(in_RDI + 8) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd80);
  return;
}

Assistant:

void InversePowerSeries::initialize() {
    InversePowerSeriesTypes.clear();
    InversePowerSeriesTids.clear();
    MixingMap.clear();
    InversePowerSeriesTids.resize(forceField_->getNAtomType(), -1);

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;
    int ipstid1, ipstid2;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isInversePowerSeries()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "InversePowerSeries::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "InversePowerSeries::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        int atid1 = at1->getIdent();
        if (InversePowerSeriesTids[atid1] == -1) {
          ipstid1 = InversePowerSeriesTypes.size();
          InversePowerSeriesTypes.insert(atid1);
          InversePowerSeriesTids[atid1] = ipstid1;
        }
        int atid2 = at2->getIdent();
        if (InversePowerSeriesTids[atid2] == -1) {
          ipstid2 = InversePowerSeriesTypes.size();
          InversePowerSeriesTypes.insert(atid2);
          InversePowerSeriesTids[atid2] = ipstid2;
        }

        InversePowerSeriesInteractionType* ipsit =
            dynamic_cast<InversePowerSeriesInteractionType*>(nbt);
        if (ipsit == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "InversePowerSeries::initialize could not convert "
                   "NonBondedInteractionType\n"
                   "\tto InversePowerSeriesInteractionType for %s - %s "
                   "interaction.\n",
                   at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        std::vector<int> powers            = ipsit->getPowers();
        std::vector<RealType> coefficients = ipsit->getCoefficients();

        addExplicitInteraction(at1, at2, powers, coefficients);
      }
    }
    initialized_ = true;
  }